

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O0

void __thiscall
Lib::DArray<unsigned_int>::sortGen<false,BoostWrapper<FreqComparator<true,OccurenceTiebreak>>>
          (DArray<unsigned_int> *this,BoostWrapper<FreqComparator<true,_OccurenceTiebreak>_> comp)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Comparison CVar4;
  size_t sVar5;
  uint *puVar6;
  unsigned_long *puVar7;
  DArray<unsigned_int> *in_RDI;
  uint aux_1;
  uint aux;
  size_t r;
  size_t l;
  uint mid;
  size_t m;
  size_t p;
  size_t to;
  size_t from;
  unsigned_long in_stack_ffffffffffffff50;
  size_t in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  uint uVar8;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  uint in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  uint in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  size_t local_58;
  ulong local_50;
  ulong local_40;
  size_t local_38;
  ulong local_30;
  ulong local_28;
  
  if (1 < in_RDI->_size) {
    if ((sortGen<false,BoostWrapper<FreqComparator<true,OccurenceTiebreak>>>(BoostWrapper<FreqComparator<true,OccurenceTiebreak>>)
         ::ft == '\0') &&
       (iVar3 = __cxa_guard_acquire(&sortGen<false,BoostWrapper<FreqComparator<true,OccurenceTiebreak>>>(BoostWrapper<FreqComparator<true,OccurenceTiebreak>>)
                                     ::ft), iVar3 != 0)) {
      DArray<unsigned_long>::DArray
                ((DArray<unsigned_long> *)
                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff58);
      __cxa_atexit(DArray<unsigned_long>::~DArray,
                   &sortGen<false,_BoostWrapper<FreqComparator<true,_OccurenceTiebreak>_>_>::ft,
                   &__dso_handle);
      __cxa_guard_release(&sortGen<false,BoostWrapper<FreqComparator<true,OccurenceTiebreak>>>(BoostWrapper<FreqComparator<true,OccurenceTiebreak>>)
                           ::ft);
    }
    local_28 = 0;
    sVar5 = size(in_RDI);
    local_30 = sVar5 - 1;
    DArray<unsigned_long>::ensure
              ((DArray<unsigned_long> *)
               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    local_38 = 0;
    while( true ) {
      do {
        iVar3 = Random::getInteger((int)(in_stack_ffffffffffffff50 >> 0x20));
        local_40 = local_28 + (long)iVar3;
        puVar6 = operator[](in_RDI,local_40);
        uVar1 = *puVar6;
        local_50 = local_28;
        local_58 = local_30;
        while (local_50 < local_40) {
          operator[](in_RDI,local_50);
          CVar4 = BoostWrapper<FreqComparator<true,_OccurenceTiebreak>_>::compare
                            ((BoostWrapper<FreqComparator<true,_OccurenceTiebreak>_> *)
                             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                             in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
          if ((uint)(CVar4 + GREATER) < 2) {
            local_50 = local_50 + 1;
          }
          else if (CVar4 == GREATER) {
            if (local_40 == local_58) {
              puVar6 = operator[](in_RDI,local_50);
              in_stack_ffffffffffffff80 = *puVar6;
              puVar6 = operator[](in_RDI,local_40);
              *puVar6 = in_stack_ffffffffffffff80;
              puVar6 = operator[](in_RDI,local_40 - 1);
              in_stack_ffffffffffffff84 = *puVar6;
              puVar6 = operator[](in_RDI,local_50);
              *puVar6 = in_stack_ffffffffffffff84;
              puVar6 = operator[](in_RDI,local_40 - 1);
              *puVar6 = uVar1;
              local_40 = local_40 - 1;
            }
            else {
              puVar6 = operator[](in_RDI,local_50);
              in_stack_ffffffffffffff7c = *puVar6;
              puVar6 = operator[](in_RDI,local_58);
              in_stack_ffffffffffffff78 = *puVar6;
              puVar6 = operator[](in_RDI,local_50);
              *puVar6 = in_stack_ffffffffffffff78;
              puVar6 = operator[](in_RDI,local_58);
              *puVar6 = in_stack_ffffffffffffff7c;
            }
            local_58 = local_58 - 1;
          }
        }
        while (local_40 < local_58) {
          operator[](in_RDI,local_40 + 1);
          CVar4 = BoostWrapper<FreqComparator<true,_OccurenceTiebreak>_>::compare
                            ((BoostWrapper<FreqComparator<true,_OccurenceTiebreak>_> *)
                             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                             in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
          if (CVar4 == LESS) {
            puVar6 = operator[](in_RDI,local_58);
            uVar8 = *puVar6;
            puVar6 = operator[](in_RDI,local_40 + 1);
            uVar2 = *puVar6;
            puVar6 = operator[](in_RDI,local_58);
            *puVar6 = uVar2;
            puVar6 = operator[](in_RDI,local_40 + 1);
            *puVar6 = uVar8;
            local_58 = local_58 - 1;
          }
          else if ((uint)CVar4 < 2) {
            puVar6 = operator[](in_RDI,local_40 + 1);
            uVar8 = *puVar6;
            puVar6 = operator[](in_RDI,local_40);
            *puVar6 = uVar8;
            uVar8 = uVar1;
            puVar6 = operator[](in_RDI,local_40 + 1);
            *puVar6 = uVar8;
            local_40 = local_40 + 1;
          }
        }
        if (local_40 + 1 < local_30) {
          in_stack_ffffffffffffff50 = local_40 + 1;
          sVar5 = local_38 + 1;
          puVar7 = DArray<unsigned_long>::operator[]
                             (&sortGen<false,_BoostWrapper<FreqComparator<true,_OccurenceTiebreak>_>_>
                               ::ft,local_38);
          *puVar7 = in_stack_ffffffffffffff50;
          local_38 = local_38 + 2;
          puVar7 = DArray<unsigned_long>::operator[]
                             (&sortGen<false,_BoostWrapper<FreqComparator<true,_OccurenceTiebreak>_>_>
                               ::ft,sVar5);
          *puVar7 = local_30;
        }
        local_30 = local_40 - 1;
      } while ((local_40 != 0) && (local_28 < local_30));
      if (local_38 == 0) break;
      puVar7 = DArray<unsigned_long>::operator[]
                         (&sortGen<false,_BoostWrapper<FreqComparator<true,_OccurenceTiebreak>_>_>::
                           ft,local_38 - 2);
      local_28 = *puVar7;
      puVar7 = DArray<unsigned_long>::operator[]
                         (&sortGen<false,_BoostWrapper<FreqComparator<true,_OccurenceTiebreak>_>_>::
                           ft,local_38 - 1);
      local_30 = *puVar7;
      local_38 = local_38 - 2;
    }
  }
  return;
}

Assistant:

void sortGen(Comparator comp)
  {
    if(_size <= 1) {
      return;
    }

    // array behaves as a stack of calls to quicksort
    static DArray<size_t> ft(32);

    size_t from = 0;
    size_t to=size()-1;
    ft.ensure(to);

    size_t p = 0; // pointer to the next element in ft
    for (;;) {
      ASS(from<size() && to<size()); //checking for underflows
      ASS(from<to);
      // invariant: from < to
      size_t m = from + Random::getInteger(to-from+1);
      C mid = (*this)[m];
      size_t l = from;
      size_t r = to;
      while (l < m) {
        switch ((Inversed?-1:1)*comp.compare((*this)[l],mid))
  	{
  	case EQUAL:
  	case LESS:
  	  l++;
  	  break;
  	case GREATER:
  	  if (m == r) {
  	    (*this)[m] = (*this)[l];
  	    (*this)[l] = (*this)[m-1];
  	    (*this)[m-1] = mid;
  	    m--;
  	    r--;
  	  }
  	  else {
  	    ASS(m < r);
  	    C aux = (*this)[l];
  	    (*this)[l] = (*this)[r];
  	    (*this)[r] = aux;
  	    r--;
  	  }
  	  break;
  	}
      }
      // l == m
      // now literals in lits[from ... m-1] are smaller than lits[m]
      // and literals in lits[r+1 ... to] are greater than lits[m]
      while (m < r) {
        switch ((Inversed?-1:1)*comp.compare(mid,(*this)[m+1]))
  	{
  	case LESS:
  	  {
  	    C aux = (*this)[r];
  	    (*this)[r] = (*this)[m+1];
  	    (*this)[m+1] = aux;
  	    r--;
  	  }
  	  break;
  	case EQUAL:
  	case GREATER:
  	  (*this)[m] = (*this)[m+1];
  	  (*this)[m+1] = mid;
  	  m++;
  	}
      }
      // now literals in lits[from ... m-1] are smaller than lits[m]
      // and all literals in lits[m+1 ... to] are greater than lits[m]
      if (m+1 < to) {
        ft[p++] = m+1;
        ft[p++] = to;
      }

      to = m-1;
      if (m!=0 && from < to) {
        continue;
      }
      if (p != 0) {
        p -= 2;
        ASS(p >= 0);
        from = ft[p];
        to = ft[p+1];
        continue;
      }
      return;
    }
  }